

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O3

HelicsTranslator helicsFederateGetTranslator(HelicsFederate fed,char *name,HelicsError *err)

{
  size_t sVar1;
  Filter *translator;
  char *pcVar2;
  HelicsTranslator pvVar3;
  string_view translatorName;
  shared_ptr<helics::Federate> fedObj;
  Federate *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  getFedSharedPtr(&local_30,(HelicsError *)fed);
  if (local_30 != (Federate *)0x0) {
    if (name == (char *)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001aecc5;
      pcVar2 = "The supplied string argument is null and therefore invalid";
    }
    else {
      sVar1 = strlen(name);
      translatorName._M_str = name;
      translatorName._M_len = sVar1;
      translator = helics::Federate::getTranslator(local_30,translatorName);
      if ((translator->super_Interface).handle.hid != -1700000000) {
        pvVar3 = findOrCreateFederateTranslator(fed,(Translator *)translator);
        goto LAB_001aecc8;
      }
      pcVar2 = "the specified Translator name is not recognized";
    }
    err->error_code = -4;
    err->message = pcVar2;
  }
LAB_001aecc5:
  pvVar3 = (HelicsTranslator)0x0;
LAB_001aecc8:
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return pvVar3;
}

Assistant:

HelicsTranslator helicsFederateGetTranslator(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(name, nullptr);
    try {
        auto& id = fedObj->getTranslator(name);
        if (!id.isValid()) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = invalidTransName;
            return nullptr;
        }
        return findOrCreateFederateTranslator(fed, id);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}